

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.cpp
# Opt level: O3

void camera_fun(int port)

{
  int __fd;
  int iVar1;
  void *__s;
  ssize_t sVar2;
  value_type_conflict *__val;
  sockaddr_in addrRec;
  Mat frame_1;
  Mat frame;
  void *local_158;
  long lStack_150;
  long local_148;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 local_128 [2];
  sockaddr local_118;
  _InputArray local_108;
  _InputArray local_f0 [4];
  Mat local_90 [96];
  
  local_118.sa_family = 2;
  local_118.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_118.sa_data._2_4_ = inet_addr("127.0.0.1");
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",port);
    return;
  }
  iVar1 = bind(__fd,&local_118,0x10);
  if (iVar1 < 0) {
    printf("%d bind fail\n",port);
    return;
  }
  cv::Mat::Mat(local_90);
  do {
    local_158 = (void *)0x0;
    lStack_150 = 0;
    local_148 = 0;
    __s = operator_new(0x1000a);
    local_158 = __s;
    local_148 = (long)__s + 0x1000a;
    memset(__s,0,0x1000a);
    lStack_150 = (long)__s + 0x1000a;
    sVar2 = recvfrom(__fd,__s,0x1000a,0,(sockaddr *)0x0,(socklen_t *)0x0);
    if ((int)sVar2 == -1) {
      printf("recieve data fail!");
      cv::waitKey(10);
    }
    else {
      local_128[0] = 0;
      local_138 = (undefined8 *)CONCAT44(local_138._4_4_,0x81030000);
      local_130 = (undefined1 *)&local_158;
      cv::imdecode(local_f0,(int)(string *)&local_138);
      local_138 = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"receive","");
      local_108.sz.width = 0;
      local_108.sz.height = 0;
      local_108.flags = 0x1010000;
      local_108.obj = local_f0;
      cv::imshow((string *)&local_138,&local_108);
      if (local_138 != local_128) {
        operator_delete(local_138);
      }
      cv::waitKey(1);
      cv::Mat::~Mat((Mat *)local_f0);
    }
    if (local_158 != (void *)0x0) {
      operator_delete(local_158);
    }
  } while( true );
}

Assistant:

void camera_fun(int port)
{				
	/*
		port为笔记本接收端口,注意和工控机发送端口保持一zhi
	*/
	struct sockaddr_in addrRec;
	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//port
	addrRec.sin_addr.s_addr = inet_addr("127.0.0.1");//ip
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);
	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int ret_bind = bind( sockClient, (struct sockaddr*)&addrRec, sizeof(sockaddr_in) );
    if(ret_bind < 0){
		printf("%d bind fail\n",port);
		return ;
	}

	struct sockaddr_in addrSend;
	int nLen = sizeof(struct sockaddr_in);
	int count;	
	Mat frame;
		
	while (1)
	{
		std::vector<uchar> buff(65546);
		count = recvfrom(sockClient,&buff[0],65546, 0, NULL,NULL);//接收压缩的数据
		if(count == -1){
			printf("recieve data fail!");
			waitKey(10);
			continue;

		}
		Mat frame = imdecode(buff, -1);//解压
		imshow("receive", frame);//显示
		waitKey(1);
	}	

	close(sockClient);

}